

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectiveParser.cpp
# Opt level: O1

void __thiscall Refal2::CDirectiveParser::twoNamesAfterName(CDirectiveParser *this)

{
  code *pcVar1;
  
  switch((this->super_CRuleParser).super_CQualifierParser.token.type) {
  case TT_Blank:
    break;
  case TT_Comma:
    pcVar1 = (code *)this->handler;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)((long)&(this->super_CRuleParser).super_CQualifierParser
                                                    .super_CModuleBuilder.super_CProgramBuilder.
                                                    super_CFunctionBuilder.super_CVariablesBuilder.
                                                    super_CErrorsHelper +
                                            *(long *)&this->field_0x1ef0) + -1);
    }
    (*pcVar1)();
    this->state = S_TwoNames;
    break;
  default:
    wrongDirectiveFormat(this);
    return;
  case TT_LineFeed:
    pcVar1 = (code *)this->handler;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)((long)&(this->super_CRuleParser).super_CQualifierParser
                                                    .super_CModuleBuilder.super_CProgramBuilder.
                                                    super_CFunctionBuilder.super_CVariablesBuilder.
                                                    super_CErrorsHelper +
                                            *(long *)&this->field_0x1ef0) + -1);
    }
    (*pcVar1)();
    if ((this->super_CRuleParser).super_CQualifierParser.super_CParsingElementState.state !=
        PES_NotFinished) {
      __assert_fail("!IsFinished()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/QualifierParser.h"
                    ,0x22,"void Refal2::CParsingElementState::SetFinished(bool)");
    }
    (this->super_CRuleParser).super_CQualifierParser.super_CParsingElementState.state = PES_Correct;
    break;
  case TT_LeftParen:
    this->state = S_TwoNamesAfterLeftParen;
  }
  return;
}

Assistant:

void CDirectiveParser::twoNamesAfterName()
{
	if( token.type == TT_Comma ) {
		( this->*handler )();
		state = S_TwoNames;
	} else if( token.type == TT_LeftParen ) {
		state = S_TwoNamesAfterLeftParen;
	} else if( token.type == TT_LineFeed ) {
		( this->*handler )();
		SetCorrect();
	} else if( token.type != TT_Blank ) {
		wrongDirectiveFormat();
	}
}